

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O1

_Bool trans_fmul_s(DisasContext_conflict12 *ctx,arg_fmul_s *a)

{
  TCGContext_conflict11 *tcg_ctx;
  bool bVar1;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_i64 local_28;
  
  if (ctx->mstatus_fs == 0) {
    return false;
  }
  bVar1 = (ctx->misa & 0x20) != 0;
  if (bVar1) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_rm(ctx,a->rm);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rs1]);
    local_28 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rs2]);
    tcg_gen_callN_riscv64
              (tcg_ctx,helper_fmul_s_riscv64,
               (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[a->rd]),3,&local_38);
    mark_fs_dirty(ctx);
  }
  return bVar1;
}

Assistant:

static bool trans_fmul_s(DisasContext *ctx, arg_fmul_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    gen_set_rm(ctx, a->rm);
    gen_helper_fmul_s(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_env,
                      tcg_ctx->cpu_fpr[a->rs1], tcg_ctx->cpu_fpr[a->rs2]);
    mark_fs_dirty(ctx);
    return true;
}